

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O3

void __thiscall embree::LineSegments::setVertexAttributeCount(LineSegments *this,uint N)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  BufferView<char> *pBVar4;
  Device *pDVar5;
  BufferView<char> *pBVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  undefined4 extraout_var;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  
  uVar18 = (ulong)N;
  uVar16 = (this->vertexAttribs).size_alloced;
  uVar15 = uVar16;
  if ((uVar16 < uVar18) && (uVar15 = uVar18, uVar14 = uVar16, uVar16 != 0)) {
    do {
      uVar15 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
      uVar14 = uVar15;
    } while (uVar15 < uVar18);
  }
  uVar14 = (this->vertexAttribs).size_active;
  if (uVar18 < uVar14) {
    lVar17 = uVar18 * 0x38 + 0x30;
    uVar16 = uVar18;
    do {
      plVar3 = *(long **)((long)&(((this->vertexAttribs).items)->super_RawBufferView).ptr_ofs +
                         lVar17);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x18))();
        uVar14 = (this->vertexAttribs).size_active;
      }
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0x38;
    } while (uVar16 < uVar14);
    uVar16 = (this->vertexAttribs).size_alloced;
    (this->vertexAttribs).size_active = uVar18;
    uVar14 = uVar18;
  }
  if (uVar16 == uVar15) {
    lVar17 = uVar18 - uVar14;
    if (uVar14 <= uVar18 && lVar17 != 0) {
      lVar13 = uVar14 * 0x38 + 0x30;
      do {
        pBVar4 = (this->vertexAttribs).items;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar13 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar13 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar4 + lVar13 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar4 + lVar13 + -8) = 1;
        *(undefined4 *)((long)pBVar4 + lVar13 + -4) = 0;
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar13) = 0;
        lVar13 = lVar13 + 0x38;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    (this->vertexAttribs).size_active = uVar18;
  }
  else {
    pDVar5 = (this->vertexAttribs).alloc.device;
    pBVar4 = (this->vertexAttribs).items;
    iVar12 = (*(pDVar5->super_State).super_RefCount._vptr_RefCount[8])(pDVar5,uVar15 * 0x38,8);
    (this->vertexAttribs).items = (BufferView<char> *)CONCAT44(extraout_var,iVar12);
    if ((this->vertexAttribs).size_active == 0) {
      uVar16 = 0;
    }
    else {
      lVar17 = 0x30;
      uVar14 = 0;
      do {
        pBVar6 = (this->vertexAttribs).items;
        puVar1 = (undefined8 *)((long)pBVar4 + lVar17 + -0x30);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)pBVar4 + lVar17 + -0x20);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)pBVar4 + lVar17 + -0x10);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)pBVar6 + lVar17 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar17 + -0x20);
        *puVar1 = uVar9;
        puVar1[1] = uVar10;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar17 + -0x30);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar17) =
             *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar17);
        *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar17) = 0;
        uVar14 = uVar14 + 1;
        uVar16 = (this->vertexAttribs).size_active;
        lVar17 = lVar17 + 0x38;
      } while (uVar14 < uVar16);
    }
    lVar17 = uVar18 - uVar16;
    if (uVar16 <= uVar18 && lVar17 != 0) {
      lVar13 = uVar16 * 0x38 + 0x30;
      do {
        pBVar6 = (this->vertexAttribs).items;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar13 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar13 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar6 + lVar13 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar6 + lVar13 + -8) = 1;
        *(undefined4 *)((long)pBVar6 + lVar13 + -4) = 0;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar13) = 0;
        lVar13 = lVar13 + 0x38;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    pDVar5 = (this->vertexAttribs).alloc.device;
    if (pDVar5 != (Device *)0x0) {
      (*(pDVar5->super_State).super_RefCount._vptr_RefCount[9])(pDVar5,pBVar4);
    }
    (this->vertexAttribs).size_active = uVar18;
    (this->vertexAttribs).size_alloced = uVar15;
  }
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void LineSegments::setVertexAttributeCount (unsigned int N)
  {
    vertexAttribs.resize(N);
    Geometry::update();
  }